

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O2

void sec_flush_some_and_unlock(tsdn_t *tsdn,sec_t *sec,sec_shard_t *shard)

{
  uint uVar1;
  sec_bin_t *psVar2;
  pszind_t pVar3;
  _Bool deferred_work_generated;
  edata_list_active_t to_flush;
  _Bool local_31;
  edata_list_active_t local_30;
  
  local_30.head.qlh_first = (anon_struct_8_1_803fbc3e_for_head)(edata_t *)0x0;
  while ((sec->opts).bytes_after_flush < shard->bytes_cur) {
    uVar1 = shard->to_flush_next;
    pVar3 = uVar1 + 1;
    if (uVar1 + 1 == sec->npsizes) {
      pVar3 = 0;
    }
    psVar2 = shard->bins;
    shard->to_flush_next = pVar3;
    if (psVar2[uVar1].bytes_cur != 0) {
      shard->bytes_cur = shard->bytes_cur - psVar2[uVar1].bytes_cur;
      psVar2[uVar1].bytes_cur = 0;
      edata_list_active_concat(&local_30,&psVar2[uVar1].freelist);
    }
  }
  (shard->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(shard->mtx).field_0 + 0x48));
  local_31 = false;
  (*sec->fallback->dalloc_batch)(tsdn,sec->fallback,&local_30,&local_31);
  return;
}

Assistant:

static void
sec_flush_some_and_unlock(tsdn_t *tsdn, sec_t *sec, sec_shard_t *shard) {
	malloc_mutex_assert_owner(tsdn, &shard->mtx);
	edata_list_active_t to_flush;
	edata_list_active_init(&to_flush);
	while (shard->bytes_cur > sec->opts.bytes_after_flush) {
		/* Pick a victim. */
		sec_bin_t *bin = &shard->bins[shard->to_flush_next];

		/* Update our victim-picking state. */
		shard->to_flush_next++;
		if (shard->to_flush_next == sec->npsizes) {
			shard->to_flush_next = 0;
		}

		assert(shard->bytes_cur >= bin->bytes_cur);
		if (bin->bytes_cur != 0) {
			shard->bytes_cur -= bin->bytes_cur;
			bin->bytes_cur = 0;
			edata_list_active_concat(&to_flush, &bin->freelist);
		}
		/*
		 * Either bin->bytes_cur was 0, in which case we didn't touch
		 * the bin list but it should be empty anyways (or else we
		 * missed a bytes_cur update on a list modification), or it
		 * *was* 0 and we emptied it ourselves.  Either way, it should
		 * be empty now.
		 */
		assert(edata_list_active_empty(&bin->freelist));
	}

	malloc_mutex_unlock(tsdn, &shard->mtx);
	bool deferred_work_generated = false;
	pai_dalloc_batch(tsdn, sec->fallback, &to_flush,
	    &deferred_work_generated);
}